

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::Resource::Resource
          (Resource *this,OperationContext *context,ResourceDescription *desc,deUint32 usage,
          VkSharingMode sharingMode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilyIndex)

{
  deUint32 height;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> data_00;
  bool bVar1;
  int iVar2;
  deUint32 width;
  DeviceInterface *vk_00;
  InstanceInterface *pIVar3;
  VkDevice device_00;
  VkPhysicalDevice pVVar4;
  Buffer *pBVar5;
  VkBuffer *pVVar6;
  deUint32 *pdVar7;
  size_type sVar8;
  NotSupportedError *this_00;
  Image *pIVar9;
  VkImage *pVVar10;
  VkImageSubresourceLayers VVar11;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined8 in_stack_fffffffffffffd60;
  undefined1 *puVar12;
  DefaultDeleter<vkt::synchronization::Image> local_1cd;
  deUint32 local_1cc;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> local_1c8;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *local_1b8;
  int local_1a4;
  undefined1 local_1a0 [4];
  VkResult formatResult;
  VkImageFormatProperties imageFormatProperties;
  VkImageCreateInfo imageInfo;
  VkImageSubresourceRange local_114;
  VkExtent3D local_100;
  int local_f0 [3];
  int local_e4;
  VkExtent3D local_e0;
  DefaultDeleter<vkt::synchronization::Buffer> local_cd;
  deUint32 local_cc;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> local_c8;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *local_b8
  ;
  undefined1 local_a8 [8];
  VkBufferCreateInfo bufferCreateInfo;
  Allocator *allocator;
  VkPhysicalDevice physDevice;
  VkDevice device;
  InstanceInterface *vki;
  DeviceInterface *vk;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilyIndex_local;
  VkSharingMode sharingMode_local;
  deUint32 usage_local;
  ResourceDescription *desc_local;
  OperationContext *context_local;
  Resource *this_local;
  
  this->m_type = desc->type;
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::MovePtr
            (&this->m_buffer);
  BufferResource::BufferResource(&this->m_bufferData);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::MovePtr
            (&this->m_image);
  ImageResource::ImageResource(&this->m_imageData);
  vk_00 = OperationContext::getDeviceInterface(context);
  pIVar3 = OperationContext::getInstanceInterface(context);
  device_00 = OperationContext::getDevice(context);
  pVVar4 = OperationContext::getPhysicalDevice(context);
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)OperationContext::getAllocator(context);
  if ((this->m_type == RESOURCE_TYPE_BUFFER) || (bVar1 = isIndirectBuffer(this->m_type), bVar1)) {
    (this->m_bufferData).offset = 0;
    iVar2 = tcu::Vector<int,_4>::x(&desc->size);
    (this->m_bufferData).size = (long)iVar2;
    makeBufferCreateInfo((VkBufferCreateInfo *)local_a8,(this->m_bufferData).size,usage);
    bufferCreateInfo.size._4_4_ = sharingMode;
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(queueFamilyIndex);
    if (sVar8 != 0) {
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(queueFamilyIndex);
      bufferCreateInfo.usage = (VkBufferUsageFlags)sVar8;
      bufferCreateInfo._40_8_ =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](queueFamilyIndex,0);
    }
    pBVar5 = (Buffer *)operator_new(0x30);
    local_cc = ::vk::MemoryRequirement::Any.m_flags;
    synchronization::Buffer::Buffer
              (pBVar5,vk_00,device_00,(Allocator *)bufferCreateInfo.pQueueFamilyIndices,
               (VkBufferCreateInfo *)local_a8,::vk::MemoryRequirement::Any);
    de::DefaultDeleter<vkt::synchronization::Buffer>::DefaultDeleter(&local_cd);
    de::details::
    MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    MovePtr((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             *)&local_c8);
    local_b8 = de::details::MovePtr::operator_cast_to_PtrData(&local_c8,(MovePtr *)pBVar5);
    data.ptr._4_4_ = in_stack_fffffffffffffd5c;
    data.ptr._0_4_ = in_stack_fffffffffffffd58;
    data._8_8_ = in_stack_fffffffffffffd60;
    de::details::
    MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    operator=(&this->m_buffer,data);
    de::details::
    MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    ~MovePtr((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_c8);
    pBVar5 = de::details::
             UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             ::operator*(&(this->m_buffer).
                          super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                        );
    pVVar6 = synchronization::Buffer::operator*(pBVar5);
    (this->m_bufferData).handle.m_internal = pVVar6->m_internal;
  }
  else if (this->m_type == RESOURCE_TYPE_IMAGE) {
    width = tcu::Vector<int,_4>::x(&desc->size);
    local_e4 = 1;
    local_f0[2] = tcu::Vector<int,_4>::y(&desc->size);
    pdVar7 = (deUint32 *)std::max<int>(&local_e4,local_f0 + 2);
    height = *pdVar7;
    local_f0[1] = 1;
    local_f0[0] = tcu::Vector<int,_4>::z(&desc->size);
    pdVar7 = (deUint32 *)std::max<int>(local_f0 + 1,local_f0);
    local_100 = ::vk::makeExtent3D(width,height,*pdVar7);
    (this->m_imageData).extent = local_100;
    (this->m_imageData).imageType = desc->imageType;
    (this->m_imageData).format = desc->imageFormat;
    local_e0 = local_100;
    ::vk::makeImageSubresourceRange(&local_114,desc->imageAspect,0,1,0,1);
    (this->m_imageData).subresourceRange.layerCount = local_114.layerCount;
    (this->m_imageData).subresourceRange.aspectMask = local_114.aspectMask;
    (this->m_imageData).subresourceRange.baseMipLevel = local_114.baseMipLevel;
    (this->m_imageData).subresourceRange.levelCount = local_114.levelCount;
    (this->m_imageData).subresourceRange.baseArrayLayer = local_114.baseArrayLayer;
    VVar11 = ::vk::makeImageSubresourceLayers(desc->imageAspect,0,0,1);
    (this->m_imageData).subresourceLayers = VVar11;
    makeImageCreateInfo((VkImageCreateInfo *)&imageFormatProperties.maxResourceSize,
                        (this->m_imageData).imageType,&(this->m_imageData).extent,
                        (this->m_imageData).format,usage);
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(queueFamilyIndex);
    if (sVar8 != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(queueFamilyIndex);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](queueFamilyIndex,0);
    }
    puVar12 = local_1a0;
    local_1a4 = (*pIVar3->_vptr_InstanceInterface[4])
                          (pIVar3,pVVar4,(ulong)imageInfo.flags,(ulong)imageInfo.pNext._4_4_,
                           (ulong)imageInfo.arrayLayers,(ulong)imageInfo.samples);
    if (local_1a4 != 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Image format is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperation.cpp"
                 ,0xd77);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    pIVar9 = (Image *)operator_new(0x30);
    local_1cc = ::vk::MemoryRequirement::Any.m_flags;
    synchronization::Image::Image
              (pIVar9,vk_00,device_00,(Allocator *)bufferCreateInfo.pQueueFamilyIndices,
               (VkImageCreateInfo *)&imageFormatProperties.maxResourceSize,
               ::vk::MemoryRequirement::Any);
    de::DefaultDeleter<vkt::synchronization::Image>::DefaultDeleter(&local_1cd);
    de::details::
    MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::MovePtr
              ((MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                *)&local_1c8);
    local_1b8 = de::details::MovePtr::operator_cast_to_PtrData(&local_1c8,(MovePtr *)pIVar9);
    data_00.ptr._4_4_ = in_stack_fffffffffffffd5c;
    data_00.ptr._0_4_ = imageInfo.pNext._0_4_;
    data_00._8_8_ = puVar12;
    de::details::
    MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
    operator=(&this->m_image,data_00);
    de::details::
    MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::~MovePtr
              ((MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                *)&local_1c8);
    pIVar9 = de::details::
             UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
             ::operator*(&(this->m_image).
                          super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                        );
    pVVar10 = synchronization::Image::operator*(pIVar9);
    (this->m_imageData).handle.m_internal = pVVar10->m_internal;
  }
  return;
}

Assistant:

Resource::Resource (OperationContext& context, const ResourceDescription& desc, const deUint32 usage, const vk::VkSharingMode sharingMode, const std::vector<deUint32>& queueFamilyIndex)
	: m_type	(desc.type)
{
	const DeviceInterface&		vk			= context.getDeviceInterface();
	const InstanceInterface&	vki			= context.getInstanceInterface();
	const VkDevice				device		= context.getDevice();
	const VkPhysicalDevice		physDevice	= context.getPhysicalDevice();
	Allocator&					allocator	= context.getAllocator();

	if (m_type == RESOURCE_TYPE_BUFFER || isIndirectBuffer(m_type))
	{
		m_bufferData.offset					= 0u;
		m_bufferData.size					= static_cast<VkDeviceSize>(desc.size.x());
		VkBufferCreateInfo bufferCreateInfo = makeBufferCreateInfo(m_bufferData.size, usage);
		bufferCreateInfo.sharingMode		= sharingMode;
		if (queueFamilyIndex.size() > 0)
		{
			bufferCreateInfo.queueFamilyIndexCount	= static_cast<deUint32>(queueFamilyIndex.size());
			bufferCreateInfo.pQueueFamilyIndices	= &queueFamilyIndex[0];
		}
		m_buffer			= de::MovePtr<Buffer>(new Buffer(vk, device, allocator, bufferCreateInfo, MemoryRequirement::Any));
		m_bufferData.handle	= **m_buffer;
	}
	else if (m_type == RESOURCE_TYPE_IMAGE)
	{
		m_imageData.extent				= makeExtent3D(desc.size.x(), std::max(1, desc.size.y()), std::max(1, desc.size.z()));
		m_imageData.imageType			= desc.imageType;
		m_imageData.format				= desc.imageFormat;
		m_imageData.subresourceRange	= makeImageSubresourceRange(desc.imageAspect, 0u, 1u, 0u, 1u);
		m_imageData.subresourceLayers	= makeImageSubresourceLayers(desc.imageAspect, 0u, 0u, 1u);
		VkImageCreateInfo imageInfo		= makeImageCreateInfo(m_imageData.imageType, m_imageData.extent, m_imageData.format, usage);
		imageInfo.sharingMode			= sharingMode;
		if (queueFamilyIndex.size() > 0)
		{
			imageInfo.queueFamilyIndexCount	= static_cast<deUint32>(queueFamilyIndex.size());
			imageInfo.pQueueFamilyIndices	= &queueFamilyIndex[0];
		}

		VkImageFormatProperties	imageFormatProperties;
		const VkResult formatResult		= vki.getPhysicalDeviceImageFormatProperties(physDevice, imageInfo.format, imageInfo.imageType, imageInfo.tiling, imageInfo.usage, imageInfo.flags, &imageFormatProperties);

		if (formatResult != VK_SUCCESS)
			TCU_THROW(NotSupportedError, "Image format is not supported");

		m_image							= de::MovePtr<Image>(new Image(vk, device, allocator, imageInfo, MemoryRequirement::Any));
		m_imageData.handle				= **m_image;
	}
	else
		DE_ASSERT(0);
}